

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStoragePython.cpp
# Opt level: O2

PyObject * PyInit_libmilstoragepython(void)

{
  int iVar1;
  char *__s1;
  class_<CoreML::MilStoragePython::MilStoragePythonWriter> *pcVar2;
  class_<CoreML::MilStoragePython::MilStoragePythonReader> *pcVar3;
  bool local_161;
  class_<CoreML::MilStoragePython::MilStoragePythonWriter> blobStorageWriter;
  module m;
  class_<CoreML::MilStoragePython::MilStoragePythonReader> blobStorageReader;
  arg local_140;
  code *local_130;
  undefined8 local_128;
  code *local_120;
  undefined8 local_118;
  code *local_110;
  undefined8 local_108;
  code *local_100;
  undefined8 local_f8;
  code *local_f0;
  undefined8 local_e8;
  code *local_e0;
  undefined8 local_d8;
  code *local_d0;
  undefined8 local_c8;
  code *local_c0;
  undefined8 local_b8;
  code *local_b0;
  undefined8 local_a8;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  undefined8 local_88;
  arg local_80;
  arg_v local_70;
  code *local_30;
  undefined8 local_28;
  code *local_20;
  undefined8 local_18;
  
  __s1 = (char *)Py_GetVersion();
  iVar1 = strncmp(__s1,"3.10",4);
  if ((iVar1 == 0) && (9 < (byte)(__s1[4] - 0x30U))) {
    pybind11::detail::get_internals();
    pybind11::module_::module_
              (&m,"libmilstoragepython","Library to create, access and edit CoreML blob files.");
    local_70.super_arg.name._0_1_ = 1;
    pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
    class_<pybind11::module_local>
              (&blobStorageWriter,(handle)m.super_object.super_handle.m_ptr,"_BlobStorageWriter",
               (module_local *)&local_70);
    local_140.name = "file_name";
    local_140._8_1_ = 2;
    local_161 = true;
    local_80.name = "truncate_file";
    local_80._8_1_ = 2;
    pybind11::arg::operator=(&local_70,&local_80,&local_161);
    pybind11::detail::initimpl::
    constructor<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool>
    ::
    execute<pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>,_pybind11::arg,_pybind11::arg_v,_0>
              (&blobStorageWriter,&local_140,&local_70);
    local_90 = CoreML::MilStoragePython::MilStoragePythonWriter::write_int4_data;
    local_88 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<signed_char,16>const&)>
                       (&blobStorageWriter,"write_int4_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_90);
    local_a0 = CoreML::MilStoragePython::MilStoragePythonWriter::write_uint1_data;
    local_98 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_char,16>const&)>
                       (pcVar2,"write_uint1_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_a0);
    local_b0 = CoreML::MilStoragePython::MilStoragePythonWriter::write_uint2_data;
    local_a8 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_char,16>const&)>
                       (pcVar2,"write_uint2_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_b0);
    local_c0 = CoreML::MilStoragePython::MilStoragePythonWriter::write_uint3_data;
    local_b8 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_char,16>const&)>
                       (pcVar2,"write_uint3_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_c0);
    local_d0 = CoreML::MilStoragePython::MilStoragePythonWriter::write_uint4_data;
    local_c8 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_char,16>const&)>
                       (pcVar2,"write_uint4_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_d0);
    local_e0 = CoreML::MilStoragePython::MilStoragePythonWriter::write_uint6_data;
    local_d8 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_char,16>const&)>
                       (pcVar2,"write_uint6_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_e0);
    local_f0 = CoreML::MilStoragePython::MilStoragePythonWriter::write_int8_data;
    local_e8 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<signed_char,16>const&)>
                       (pcVar2,"write_int8_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_f0);
    local_100 = CoreML::MilStoragePython::MilStoragePythonWriter::write_uint8_data;
    local_f8 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_char,16>const&)>
                       (pcVar2,"write_uint8_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_100);
    local_110 = CoreML::MilStoragePython::MilStoragePythonWriter::write_int16_data;
    local_108 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<short,16>const&)>
                       (pcVar2,"write_int16_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_110);
    local_120 = CoreML::MilStoragePython::MilStoragePythonWriter::write_uint16_data;
    local_118 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_short,16>const&)>
                       (pcVar2,"write_uint16_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_120);
    local_130 = CoreML::MilStoragePython::MilStoragePythonWriter::write_int32_data;
    local_128 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<int,16>const&)>
                       (pcVar2,"write_int32_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_130);
    blobStorageReader.super_generic_type.super_object.super_handle.m_ptr =
         (generic_type)CoreML::MilStoragePython::MilStoragePythonWriter::write_uint32_data;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_int,16>const&)>
                       (pcVar2,"write_uint32_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&blobStorageReader);
    local_20 = CoreML::MilStoragePython::MilStoragePythonWriter::write_fp16_data;
    local_18 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_short,16>const&)>
                       (pcVar2,"write_fp16_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_20);
    local_30 = CoreML::MilStoragePython::MilStoragePythonWriter::write_float_data;
    local_28 = 0;
    pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
    def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<float,16>const&)>
              (pcVar2,"write_float_data",(offset_in_MilStoragePythonWriter_to_subr *)&local_30);
    pybind11::arg_v::~arg_v(&local_70);
    local_70.super_arg.name = (char *)CONCAT71(local_70.super_arg.name._1_7_,1);
    pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
    class_<pybind11::module_local>
              (&blobStorageReader,(handle)m.super_object.super_handle.m_ptr,"_BlobStorageReader",
               (module_local *)&local_70);
    pybind11::detail::initimpl::
    constructor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    execute<pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>,_0>
              (&blobStorageReader);
    local_70.super_arg.name =
         (char *)CoreML::MilStoragePython::MilStoragePythonReader::read_int4_data;
    local_70.super_arg._8_8_ = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<signed_char,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (&blobStorageReader,"read_int4_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_70);
    local_140.name = (char *)CoreML::MilStoragePython::MilStoragePythonReader::read_uint1_data;
    local_140._8_8_ = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_char,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_uint1_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_140);
    local_80.name = (char *)CoreML::MilStoragePython::MilStoragePythonReader::read_uint2_data;
    local_80._8_8_ = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_char,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_uint2_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_80);
    local_90 = CoreML::MilStoragePython::MilStoragePythonReader::read_uint3_data;
    local_88 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_char,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_uint3_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_90);
    local_a0 = CoreML::MilStoragePython::MilStoragePythonReader::read_uint4_data;
    local_98 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_char,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_uint4_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_a0);
    local_b0 = CoreML::MilStoragePython::MilStoragePythonReader::read_uint6_data;
    local_a8 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_char,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_uint6_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_b0);
    local_c0 = CoreML::MilStoragePython::MilStoragePythonReader::read_int8_data;
    local_b8 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<signed_char,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_int8_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_c0);
    local_d0 = CoreML::MilStoragePython::MilStoragePythonReader::read_uint8_data;
    local_c8 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_char,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_uint8_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_d0);
    local_e0 = CoreML::MilStoragePython::MilStoragePythonReader::read_int16_data;
    local_d8 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<short,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_int16_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_e0);
    local_f0 = CoreML::MilStoragePython::MilStoragePythonReader::read_uint16_data;
    local_e8 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_short,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_uint16_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_f0);
    local_100 = CoreML::MilStoragePython::MilStoragePythonReader::read_int32_data;
    local_f8 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<int,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_int32_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_100);
    local_110 = CoreML::MilStoragePython::MilStoragePythonReader::read_uint32_data;
    local_108 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_int,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_uint32_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_110);
    local_120 = CoreML::MilStoragePython::MilStoragePythonReader::read_fp16_data;
    local_118 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_short,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_fp16_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_120);
    local_130 = CoreML::MilStoragePython::MilStoragePythonReader::read_float_data;
    local_128 = 0;
    pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
    def<pybind11::array_t<float,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
              (pcVar3,"read_float_data",(offset_in_MilStoragePythonWriter_to_subr *)&local_130);
    pybind11::object::~object((object *)&blobStorageReader);
    pybind11::object::~object((object *)&blobStorageWriter);
    pybind11::object::~object(&m.super_object);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    m.super_object.super_handle.m_ptr = (object)(object)(PyObject *)0x0;
  }
  return (PyObject *)m.super_object.super_handle.m_ptr;
}

Assistant:

PYBIND11_PLUGIN(libmilstoragepython) {
    py::module m("libmilstoragepython", "Library to create, access and edit CoreML blob files.");

    // As we have both pybind for the same MilStoragePythonWriter class, we need to set module_local
    // to avoid conflicts between coremltools and coremltools-internal.
    py::class_<MilStoragePythonWriter> blobStorageWriter(m, "_BlobStorageWriter", py::module_local());
    blobStorageWriter.def(py::init<const std::string&, bool>(), py::arg("file_name"), py::arg("truncate_file") = true)
      .def("write_int4_data", &MilStoragePythonWriter::write_int4_data)
      .def("write_uint1_data", &MilStoragePythonWriter::write_uint1_data)
      .def("write_uint2_data", &MilStoragePythonWriter::write_uint2_data)
      .def("write_uint3_data", &MilStoragePythonWriter::write_uint3_data)
      .def("write_uint4_data", &MilStoragePythonWriter::write_uint4_data)
      .def("write_uint6_data", &MilStoragePythonWriter::write_uint6_data)
      .def("write_int8_data", &MilStoragePythonWriter::write_int8_data)
      .def("write_uint8_data", &MilStoragePythonWriter::write_uint8_data)
      .def("write_int16_data", &MilStoragePythonWriter::write_int16_data)
      .def("write_uint16_data", &MilStoragePythonWriter::write_uint16_data)
      .def("write_int32_data", &MilStoragePythonWriter::write_int32_data)
      .def("write_uint32_data", &MilStoragePythonWriter::write_uint32_data)
      .def("write_fp16_data", &MilStoragePythonWriter::write_fp16_data)
      .def("write_float_data", &MilStoragePythonWriter::write_float_data);

    py::class_<MilStoragePythonReader> blobStorageReader(m, "_BlobStorageReader", py::module_local());
    blobStorageReader.def(py::init<std::string>())
      .def("read_int4_data", &MilStoragePythonReader::read_int4_data)
      .def("read_uint1_data", &MilStoragePythonReader::read_uint1_data)
      .def("read_uint2_data", &MilStoragePythonReader::read_uint2_data)
      .def("read_uint3_data", &MilStoragePythonReader::read_uint3_data)
      .def("read_uint4_data", &MilStoragePythonReader::read_uint4_data)
      .def("read_uint6_data", &MilStoragePythonReader::read_uint6_data)
      .def("read_int8_data", &MilStoragePythonReader::read_int8_data)
      .def("read_uint8_data", &MilStoragePythonReader::read_uint8_data)
      .def("read_int16_data", &MilStoragePythonReader::read_int16_data)
      .def("read_uint16_data", &MilStoragePythonReader::read_uint16_data)
      .def("read_int32_data", &MilStoragePythonReader::read_int32_data)
      .def("read_uint32_data", &MilStoragePythonReader::read_uint32_data)
      .def("read_fp16_data", &MilStoragePythonReader::read_fp16_data)
      .def("read_float_data", &MilStoragePythonReader::read_float_data);

    return m.ptr();
}